

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int filevisitalt(int f,int n)

{
  int iVar1;
  char *pcVar2;
  char local_418 [8];
  char fname [1024];
  
  iVar1 = getbufcwd(local_418,0x400);
  if (iVar1 != 1) {
    local_418[0] = '\0';
  }
  iVar1 = 0;
  pcVar2 = eread("Find alternate file: ",local_418,0x400,0x3c);
  if (pcVar2 == (char *)0x0) {
    iVar1 = 2;
  }
  else if (*pcVar2 != '\0') {
    iVar1 = do_filevisitalt(local_418);
  }
  return iVar1;
}

Assistant:

int
filevisitalt(int f, int n)
{
	char	 fname[NFILEN], *bufp;

	if (getbufcwd(fname, sizeof(fname)) != TRUE)
		fname[0] = '\0';
	bufp = eread("Find alternate file: ", fname, NFILEN,
	    EFNEW | EFCR | EFFILE | EFDEF);
	if (bufp == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);

	return (do_filevisitalt(fname));
}